

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLBigDecimal::XMLBigDecimal
          (XMLBigDecimal *this,XMLCh *strValue,MemoryManager *manager)

{
  short *psVar1;
  XMLCh *pXVar2;
  int iVar3;
  undefined4 extraout_var;
  NumberFormatException *this_00;
  long lVar4;
  CleanupType_conflict3 cleanup;
  JanitorMemFunCall<xercesc_4_0::XMLBigDecimal> local_48;
  
  XMLNumber::XMLNumber(&this->super_XMLNumber);
  (this->super_XMLNumber).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__XMLBigDecimal_0040cf00;
  this->fSign = 0;
  this->fTotalDigits = 0;
  this->fScale = 0;
  this->fRawDataLen = 0;
  this->fRawData = (XMLCh *)0x0;
  this->fIntVal = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  if ((strValue != (XMLCh *)0x0) && (*strValue != L'\0')) {
    local_48.fToCall = (MFPT)cleanUp;
    local_48._16_8_ = 0;
    lVar4 = 0;
    do {
      psVar1 = (short *)((long)strValue + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    this->fRawDataLen = (lVar4 >> 1) - 1;
    local_48.fObject = this;
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,(lVar4 >> 1) * 4);
    this->fRawData = (XMLCh *)CONCAT44(extraout_var,iVar3);
    memcpy((XMLCh *)CONCAT44(extraout_var,iVar3),strValue,this->fRawDataLen * 2);
    pXVar2 = this->fRawData + this->fRawDataLen;
    *pXVar2 = L'\0';
    this->fIntVal = pXVar2 + 1;
    parseDecimal(strValue,pXVar2 + 1,&this->fSign,(int *)&this->fTotalDigits,(int *)&this->fScale,
                 this->fMemoryManager);
    local_48.fObject = (XMLBigDecimal *)0x0;
    JanitorMemFunCall<xercesc_4_0::XMLBigDecimal>::~JanitorMemFunCall(&local_48);
    return;
  }
  this_00 = (NumberFormatException *)__cxa_allocate_exception(0x30);
  NumberFormatException::NumberFormatException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
             ,0x40,XMLNUM_emptyString,this->fMemoryManager);
  __cxa_throw(this_00,&NumberFormatException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLBigDecimal::XMLBigDecimal(const XMLCh* const strValue,
                             MemoryManager* const manager)
: fSign(0)
, fTotalDigits(0)
, fScale(0)
, fRawDataLen(0)
, fRawData(0)
, fIntVal(0)
, fMemoryManager(manager)
{
    if ((!strValue) || (!*strValue))
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, fMemoryManager);

    CleanupType cleanup(this, &XMLBigDecimal::cleanUp);

    try
    {
        fRawDataLen = XMLString::stringLen(strValue);
        fRawData = (XMLCh*) fMemoryManager->allocate
        (
            ((fRawDataLen*2) + 2) * sizeof(XMLCh) //fRawData and fIntVal
        );
        memcpy(fRawData, strValue, fRawDataLen * sizeof(XMLCh));
        fRawData[fRawDataLen] = chNull;
        fIntVal = fRawData + fRawDataLen + 1;
        parseDecimal(strValue, fIntVal, fSign, (int&) fTotalDigits, (int&) fScale, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}